

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,REF_DBL *hessian)

{
  REF_NODE ref_node;
  uint uVar1;
  long lVar2;
  REF_DBL *m;
  REF_DBL diag_system [12];
  double local_98;
  double local_90;
  double local_88;
  
  ref_node = ref_grid->node;
  if (0 < ref_node->max) {
    lVar2 = 0;
    m = hessian;
    do {
      if ((-1 < ref_node->global[lVar2]) && (ref_node->ref_mpi->id == ref_node->part[lVar2])) {
        uVar1 = ref_matrix_diag_m(m,&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x557,"ref_recon_abs_value_hessian",(ulong)uVar1,"decomp");
          return uVar1;
        }
        if (local_98 <= -local_98) {
          local_98 = -local_98;
        }
        if (local_90 <= -local_90) {
          local_90 = -local_90;
        }
        if (local_88 <= -local_88) {
          local_88 = -local_88;
        }
        uVar1 = ref_matrix_form_m(&local_98,m);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x55b,"ref_recon_abs_value_hessian",(ulong)uVar1,"re-form");
          return uVar1;
        }
      }
      lVar2 = lVar2 + 1;
      m = m + 6;
    } while (lVar2 < ref_node->max);
  }
  uVar1 = ref_node_ghost_dbl(ref_node,hessian,6);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x55f,
           "ref_recon_abs_value_hessian",(ulong)uVar1,"update ghosts");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,
                                               REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m(&(hessian[6 * node]), diag_system), "decomp");
      ref_matrix_eig(diag_system, 0) = ABS(ref_matrix_eig(diag_system, 0));
      ref_matrix_eig(diag_system, 1) = ABS(ref_matrix_eig(diag_system, 1));
      ref_matrix_eig(diag_system, 2) = ABS(ref_matrix_eig(diag_system, 2));
      RSS(ref_matrix_form_m(diag_system, &(hessian[6 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");

  return REF_SUCCESS;
}